

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_decode.c
# Opt level: O0

void buffer_decode_register_write(cpu_mapping *mapping,uint32_t start,uint32_t len)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  gpu_object *pgVar8;
  gpu_object *pgVar9;
  fifo_state *pfVar10;
  gpu_mapping *pgVar11;
  gpu_mapping *gpu_mapping_1;
  gpu_object *fifo_1;
  uint64_t uStack_4b0;
  uint32_t pb_gpu_addr_1;
  gpu_mapping *gpu_mapping;
  gpu_object *obj;
  uint64_t pb_gpu_addr;
  gpu_object *fifo;
  uint32_t *data_1;
  uint32_t idx;
  _Bool pb_pointer_found;
  _Bool ib_supported;
  int chipset;
  gpu_object *dev;
  uint64_t gpu_addr;
  uint32_t left;
  uint32_t addr;
  uchar *data;
  char comment [50];
  char local_418 [8];
  char pushbuf_desc [1024];
  uint32_t len_local;
  uint32_t start_local;
  cpu_mapping *mapping_local;
  
  data._0_1_ = 0;
  local_418[0] = '\0';
  puVar3 = mapping->data;
  pushbuf_desc._1016_4_ = len;
  pushbuf_desc._1020_4_ = start;
  dev = (gpu_object *)cpu_mapping_to_gpu_addr(mapping,(ulong)start);
  if (dev != (gpu_object *)0x0) {
    dev = (gpu_object *)((long)dev - (ulong)(uint)pushbuf_desc._1020_4_);
  }
  if (mapping->fdtype == FDNVIDIA) {
    pgVar8 = nvrm_get_device(mapping->object);
    iVar6 = nvrm_get_chipset(pgVar8);
    _Var5 = nvrm_get_pb_pointer_found(pgVar8);
    if ((iVar6 != 0x50 && iVar6 < 0x80) || (_Var5)) {
      if ((!_Var5) &&
         ((pushbuf_desc._1020_4_ == 0x40 && (uVar7 = *(uint *)(mapping->data + 0x40), uVar7 != 0))))
      {
        pgVar9 = nvrm_get_fifo(mapping->object,
                               (long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)start,1);
        if ((pgVar9 != (gpu_object *)0x0) &&
           (iVar6 = is_fifo_and_addr_belongs
                              (pgVar9,(long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)start),
           iVar6 != 0)) {
          nvrm_device_set_pb_pointer_found(pgVar8,true);
        }
        _Var5 = nvrm_get_pb_pointer_found(pgVar8);
        if ((!_Var5) &&
           (pgVar11 = gpu_mapping_find((ulong)uVar7,pgVar8), pgVar11 != (gpu_mapping *)0x0)) {
          nvrm_device_set_pb_pointer_found(pgVar8,true);
        }
        _Var5 = nvrm_get_pb_pointer_found(pgVar8);
        if (_Var5) {
          if (((info != 0) && (decode_pb != 0)) &&
             (fprintf(_stdout,"USER buffer: %d\n",(ulong)mapping->id), mmt_sync_fd != -1)) {
            fflush(_stdout);
          }
          (mapping->user).is = 1;
        }
      }
    }
    else {
      uVar7 = (uint)pushbuf_desc._1020_4_ >> 2;
      puVar4 = mapping->data;
      if ((((uVar7 & 1) == 1) && (*(int *)(puVar4 + (ulong)(uVar7 - 1) * 4) != 0)) &&
         ((*(int *)(puVar4 + (ulong)uVar7 * 4) != 0 &&
          ((*(uint *)(puVar4 + (ulong)(uVar7 - 1) * 4) & 3) == 0)))) {
        if (((dev != (gpu_object *)0x0) &&
            (pgVar9 = nvrm_get_fifo(mapping->object,
                                    (long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)start,1),
            pgVar9 != (gpu_object *)0x0)) &&
           (iVar6 = is_fifo_and_addr_belongs
                              (pgVar9,(long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)start),
           iVar6 != 0)) {
          nvrm_device_set_pb_pointer_found(pgVar8,true);
          pfVar10 = get_fifo_state(pgVar9);
          (mapping->ib).entries = (uint32_t)(pfVar10->ib).entries;
        }
        _Var5 = nvrm_get_pb_pointer_found(pgVar8);
        if (!_Var5) {
          uVar1 = *(undefined4 *)(puVar4 + (ulong)uVar7 * 4);
          uVar2 = *(undefined4 *)(puVar4 + (ulong)(uVar7 - 1) * 4);
          for (gpu_mapping = (gpu_mapping *)gpu_objects; gpu_mapping != (gpu_mapping *)0x0;
              gpu_mapping = (gpu_mapping *)gpu_mapping[1].length) {
            for (uStack_4b0 = gpu_mapping[1].address; uStack_4b0 != 0;
                uStack_4b0 = *(uint64_t *)(uStack_4b0 + 0x30)) {
              if ((*(ulong *)(uStack_4b0 + 0x18) == (CONCAT44(uVar1,uVar2) & 0xfffffffffc)) &&
                 ((ulong)(((*(uint *)(puVar4 + (ulong)uVar7 * 4) & 0x7fffffff) >> 10) << 2) <=
                  *(ulong *)(uStack_4b0 + 0x20))) {
                nvrm_device_set_pb_pointer_found(pgVar8,true);
                break;
              }
            }
            _Var5 = nvrm_get_pb_pointer_found(pgVar8);
            if (_Var5) break;
          }
        }
        _Var5 = nvrm_get_pb_pointer_found(pgVar8);
        if (_Var5) {
          if (((info != 0) && (decode_pb != 0)) &&
             (fprintf(_stdout,"IB buffer: %d\n",(ulong)mapping->id), mmt_sync_fd != -1)) {
            fflush(_stdout);
          }
          (mapping->ib).is = 1;
          (mapping->ib).offset = pushbuf_desc._1020_4_ - 4;
        }
      }
    }
  }
  gpu_addr._0_4_ = len;
  gpu_addr._4_4_ = start;
  if ((mapping->ib).is == 0) {
    if ((mapping->user).is != 0) {
      pgVar8 = nvrm_get_fifo(mapping->object,
                             (long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)start,0);
      (mapping->user).state.pstate.fifo = pgVar8;
    }
  }
  else if (((mapping->ib).offset <= start) && ((ulong)start < mapping->length)) {
    pgVar8 = nvrm_get_fifo(mapping->object,
                           (long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)start,0);
    (mapping->ib).state.pstate.fifo = pgVar8;
  }
  while (gpu_addr._4_4_ < (uint)(pushbuf_desc._1020_4_ + pushbuf_desc._1016_4_)) {
    if ((print_gpu_addresses != 0) && (dev != (gpu_object *)0x0)) {
      sprintf((char *)&data," (gpu=0x%08lx)",
              (long)&((gpu_object *)(dev->usage + -6))->fd + (ulong)gpu_addr._4_4_);
    }
    if ((uint32_t)gpu_addr < 4) {
      if ((uint32_t)gpu_addr < 2) {
        if ((dump_memory_writes != 0) &&
           (fprintf(_stdout,"w %d:0x%04x%s, 0x%02x\n",(ulong)mapping->id,(ulong)gpu_addr._4_4_,&data
                    ,(ulong)puVar3[gpu_addr._4_4_]), mmt_sync_fd != -1)) {
          fflush(_stdout);
        }
        gpu_addr._4_4_ = gpu_addr._4_4_ + 1;
        gpu_addr._0_4_ = (uint32_t)gpu_addr - 1;
      }
      else {
        if ((dump_memory_writes != 0) &&
           (fprintf(_stdout,"w %d:0x%04x%s, 0x%04x\n",(ulong)mapping->id,(ulong)gpu_addr._4_4_,&data
                    ,(ulong)*(ushort *)(puVar3 + gpu_addr._4_4_)), mmt_sync_fd != -1)) {
          fflush(_stdout);
        }
        gpu_addr._4_4_ = gpu_addr._4_4_ + 2;
        gpu_addr._0_4_ = (uint32_t)gpu_addr - 2;
      }
    }
    else {
      if (((((mapping->ib).is == 0) || (gpu_addr._4_4_ < (mapping->ib).offset)) ||
          (mapping->length <= (ulong)gpu_addr._4_4_)) ||
         (((mapping->ib).entries != 0 &&
          ((mapping->ib).offset + (mapping->ib).entries * 8 <= gpu_addr._4_4_)))) {
        if ((mapping->user).is == 0) {
          if ((dump_memory_writes != 0) &&
             (fprintf(_stdout,"w %d:0x%04x%s, 0x%08x\n",(ulong)mapping->id,(ulong)gpu_addr._4_4_,
                      &data,(ulong)*(uint *)(puVar3 + gpu_addr._4_4_)), mmt_sync_fd != -1)) {
            fflush(_stdout);
          }
        }
        else {
          user_decode(&(mapping->user).state,gpu_addr._4_4_,*(uint32_t *)(puVar3 + gpu_addr._4_4_),
                      local_418);
          if ((dump_memory_writes != 0) &&
             (fprintf(_stdout,"w %d:0x%04x%s, 0x%08x  %s\n",(ulong)mapping->id,(ulong)gpu_addr._4_4_
                      ,&data,(ulong)*(uint *)(puVar3 + gpu_addr._4_4_),local_418), mmt_sync_fd != -1
             )) {
            fflush(_stdout);
          }
          user_decode_end(&(mapping->user).state);
        }
      }
      else {
        if ((gpu_addr._4_4_ & 4) == 4) {
          ib_decode(&(mapping->ib).state,*(uint32_t *)(puVar3 + ((ulong)gpu_addr._4_4_ - 4)),
                    local_418);
          ib_decode(&(mapping->ib).state,*(uint32_t *)(puVar3 + gpu_addr._4_4_),local_418);
        }
        if ((dump_memory_writes != 0) &&
           (fprintf(_stdout,"w %d:0x%04x%s, 0x%08x  %s\n",(ulong)mapping->id,(ulong)gpu_addr._4_4_,
                    &data,(ulong)*(uint *)(puVar3 + gpu_addr._4_4_),local_418), mmt_sync_fd != -1))
        {
          fflush(_stdout);
        }
        if ((gpu_addr._4_4_ & 4) == 4) {
          ib_decode_end(&(mapping->ib).state);
        }
      }
      gpu_addr._4_4_ = gpu_addr._4_4_ + 4;
      gpu_addr._0_4_ = (uint32_t)gpu_addr - 4;
    }
  }
  return;
}

Assistant:

void buffer_decode_register_write(struct cpu_mapping *mapping, uint32_t start, uint32_t len)
{
	char pushbuf_desc[1024];
	char comment[50];
	comment[0] = 0;
	pushbuf_desc[0] = 0;

	unsigned char *data = mapping->data;
	uint32_t addr = start;
	uint32_t left = len;

	uint64_t gpu_addr = cpu_mapping_to_gpu_addr(mapping, start);
	if (gpu_addr)
		gpu_addr -= start;

	if (mapping->fdtype == FDNVIDIA)
	{
		struct gpu_object *dev = nvrm_get_device(mapping->object);
		int chipset = nvrm_get_chipset(dev);
		bool ib_supported = chipset == 0x50 || chipset >= 0x80;
		bool pb_pointer_found = nvrm_get_pb_pointer_found(dev);

		if (ib_supported && !pb_pointer_found)
		{
			uint32_t idx = start / 4;
			uint32_t *data = (uint32_t *)mapping->data;
			if ((idx & 1) == 1 && data[idx - 1] && data[idx] && !(data[idx - 1] & 0x3))
			{
				if (gpu_addr)
				{
					struct gpu_object *fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 1);
					if (fifo && is_fifo_and_addr_belongs(fifo, gpu_addr + addr))
					{
						nvrm_device_set_pb_pointer_found(dev, true);
						mapping->ib.entries = get_fifo_state(fifo)->ib.entries;
					}
				}

				if (!nvrm_get_pb_pointer_found(dev))
				{
					uint64_t pb_gpu_addr = (((uint64_t)(data[idx] & 0xff)) << 32) | (data[idx - 1] & 0xfffffffc);
					struct gpu_object *obj;
					for (obj = gpu_objects; obj != NULL; obj = obj->next)
					{
						struct gpu_mapping *gpu_mapping;
						for (gpu_mapping = obj->gpu_mappings; gpu_mapping != NULL; gpu_mapping = gpu_mapping->next)
						{
							if (gpu_mapping->address == pb_gpu_addr &&
								gpu_mapping->length >=  4 * ((data[idx] & 0x7fffffff) >> 10))
							{
								nvrm_device_set_pb_pointer_found(dev, true);
								break;
							}
						}

						if (nvrm_get_pb_pointer_found(dev))
							break;
					}
				}

				if (nvrm_get_pb_pointer_found(dev))
				{
					if (info && decode_pb)
						mmt_printf("IB buffer: %d\n", mapping->id);

					mapping->ib.is = 1;
					mapping->ib.offset = start - 4;
				}
			}
		}
		else if (!pb_pointer_found)
		{
			if (start == 0x40)
			{
				uint32_t pb_gpu_addr = *(uint32_t *)&(mapping->data[0x40]);
				if (pb_gpu_addr)
				{
					struct gpu_object *fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 1);
					if (fifo && is_fifo_and_addr_belongs(fifo, gpu_addr + addr))
						nvrm_device_set_pb_pointer_found(dev, true);

					if (!nvrm_get_pb_pointer_found(dev))
					{
						struct gpu_mapping *gpu_mapping = gpu_mapping_find(pb_gpu_addr, dev);
						if (gpu_mapping)
							nvrm_device_set_pb_pointer_found(dev, true);
					}

					if (nvrm_get_pb_pointer_found(dev))
					{
						if (info && decode_pb)
							mmt_printf("USER buffer: %d\n", mapping->id);

						mapping->user.is = 1;
					}
				}
			}
		}
	}

	if (mapping->ib.is)
	{
		if (addr >= mapping->ib.offset && addr < mapping->length)
			mapping->ib.state.pstate.fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 0);
	}
	else if (mapping->user.is)
		mapping->user.state.pstate.fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 0);

	while (addr < start + len)
	{
		if (print_gpu_addresses && gpu_addr)
			sprintf(comment, " (gpu=0x%08" PRIx64 ")", gpu_addr + addr);

		if (left >= 4)
		{
			if (mapping->ib.is &&
					addr >= mapping->ib.offset &&
					addr < mapping->length &&
					(!mapping->ib.entries || addr < mapping->ib.offset + 8 * mapping->ib.entries))
			{
				if ((addr & 4) == 4)
				{
					ib_decode(&mapping->ib.state, *(uint32_t *)(data + addr - 4), pushbuf_desc);
					ib_decode(&mapping->ib.state, *(uint32_t *)(data + addr), pushbuf_desc);
				}

				if (dump_memory_writes)
					mmt_printf("w %d:0x%04x%s, 0x%08x  %s\n", mapping->id, addr, comment, *(uint32_t *)(data + addr), pushbuf_desc);

				if ((addr & 4) == 4)
					ib_decode_end(&mapping->ib.state);
			}
			else if (mapping->user.is)
			{
				user_decode(&mapping->user.state, addr, *(uint32_t *)(data + addr), pushbuf_desc);

				if (dump_memory_writes)
					mmt_printf("w %d:0x%04x%s, 0x%08x  %s\n", mapping->id, addr, comment, *(uint32_t *)(data + addr), pushbuf_desc);

				user_decode_end(&mapping->user.state);
			}
			else
			{
				if (dump_memory_writes)
					mmt_printf("w %d:0x%04x%s, 0x%08x\n", mapping->id, addr, comment, *(uint32_t *)(data + addr));
			}

			addr += 4;
			left -= 4;
		}
		else if (left >= 2)
		{
			if (dump_memory_writes)
				mmt_printf("w %d:0x%04x%s, 0x%04x\n", mapping->id, addr, comment, *(uint16_t *)(data + addr));
			addr += 2;
			left -= 2;
		}
		else
		{
			if (dump_memory_writes)
				mmt_printf("w %d:0x%04x%s, 0x%02x\n", mapping->id, addr, comment, *(uint8_t *)(data + addr));
			++addr;
			--left;
		}
	}
}